

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitterSystem.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::EmitterSystem::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EmitterSystem *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KStringStream ss;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Emitter System:");
  poVar1 = std::operator<<(poVar1,"\n\tName:     ");
  ENUMS::GetEnumAsStringEmitterName_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)this->m_ui16EmitterName,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\n\tFunction: ");
  ENUMS::GetEnumAsStringEmitterFunction_abi_cxx11_
            (&local_1e0,(ENUMS *)(ulong)this->m_ui8Function,Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\n\tID:       ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8EmitterIDNumber);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString EmitterSystem::GetAsString() const
{
    KStringStream ss;

    ss << "Emitter System:"
       << "\n\tName:     " << GetEnumAsStringEmitterName( m_ui16EmitterName )
       << "\n\tFunction: " << GetEnumAsStringEmitterFunction( m_ui8Function )
       << "\n\tID:       " << ( KUINT16 )m_ui8EmitterIDNumber
       << "\n";

    return ss.str();
}